

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O1

double __thiscall PFloat::GetValueFloat(PFloat *this,void *addr)

{
  int iVar1;
  double dVar2;
  
  if (((this->super_PBasicType).super_PType.Align - 1 & (uint)addr) != 0) {
    __assert_fail("((intptr_t)addr & (Align - 1)) == 0 && \"unaligned address\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobjtype.cpp"
                  ,0x56e,"virtual double PFloat::GetValueFloat(void *) const");
  }
  iVar1 = *(int *)&(this->super_PBasicType).super_PType.super_DObject.field_0x24;
  if (iVar1 == 8) {
    dVar2 = *addr;
  }
  else {
    if (iVar1 != 4) {
      __assert_fail("Size == 8",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobjtype.cpp"
                    ,0x575,"virtual double PFloat::GetValueFloat(void *) const");
    }
    dVar2 = (double)*addr;
  }
  return dVar2;
}

Assistant:

double PFloat::GetValueFloat(void *addr) const
{
	assert(((intptr_t)addr & (Align - 1)) == 0 && "unaligned address");
	if (Size == 4)
	{
		return *(float *)addr;
	}
	else
	{
		assert(Size == 8);
		return *(double *)addr;
	}
}